

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

bool __thiscall
RtApiAlsa::probeDeviceOpen
          (RtApiAlsa *this,uint deviceId,StreamMode mode,uint channels,uint firstChannel,
          uint sampleRate,RtAudioFormat format,uint *bufferSize,StreamOptions *options)

{
  ostringstream *poVar1;
  pthread_cond_t *__cond;
  CallbackInfo *__arg;
  ThreadHandle *__newthread;
  snd_pcm_t *psVar2;
  long lVar3;
  RtAudioFormat RVar4;
  undefined8 uVar5;
  StreamMode mode_00;
  snd_pcm_t sVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  pointer ppVar11;
  long lVar12;
  size_t sVar13;
  ostream *poVar14;
  char *pcVar15;
  void *pvVar16;
  long *plVar17;
  int i;
  long lVar18;
  int __algorithm;
  bool bVar19;
  ulong uVar20;
  undefined1 *__s;
  ulong uStack_f0;
  undefined1 auStack_e8 [12];
  sched_param local_dc;
  uint uStack_d8;
  sched_param param;
  snd_pcm_uframes_t periodSize;
  snd_pcm_uframes_t val;
  undefined1 local_c0 [4];
  int dir;
  pthread_attr_t attr;
  string name;
  uint sampleRate_local;
  long lStack_58;
  uint value;
  long *local_50;
  uint local_48;
  StreamMode local_44;
  uint periods;
  snd_pcm_t *phandle;
  
  __s = auStack_e8;
  local_50 = (long *)CONCAT44(local_50._4_4_,channels);
  attr._48_8_ = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  for (ppVar11 = (this->deviceIdPairs_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; name.field_2._12_4_ = sampleRate,
      ppVar11 !=
      (this->deviceIdPairs_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVar11 = ppVar11 + 1) {
    if (ppVar11->second == deviceId) {
      uStack_f0 = 0x17a9f7;
      std::__cxx11::string::_M_assign((string *)(attr.__size + 0x30));
      break;
    }
  }
  uVar20 = 2;
  uStack_f0 = 0x17aa13;
  iVar7 = snd_pcm_open(&periods,attr._48_8_,mode != OUTPUT);
  if (iVar7 < 0) {
    poVar1 = &(this->super_RtApi).errorStream_;
    if (mode == OUTPUT) {
      uStack_f0 = 0x17ab6c;
      poVar14 = std::operator<<((ostream *)poVar1,"RtApiAlsa::probeDeviceOpen: pcm device (");
      uStack_f0 = 0x17ab78;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      pcVar15 = ") won\'t open for output.";
    }
    else {
      uStack_f0 = 0x17aad2;
      poVar14 = std::operator<<((ostream *)poVar1,"RtApiAlsa::probeDeviceOpen: pcm device (");
      uStack_f0 = 0x17aade;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      pcVar15 = ") won\'t open for input.";
    }
    uStack_f0 = 0x17ab87;
    std::operator<<(poVar14,pcVar15);
    uStack_f0 = 0x17ab97;
    std::__cxx11::stringbuf::str();
    goto LAB_0017b084;
  }
  uStack_f0 = 0x17aa28;
  local_44 = mode;
  phandle = (snd_pcm_t *)this;
  lVar12 = snd_pcm_hw_params_sizeof();
  lVar12 = -(lVar12 + 0xfU & 0xfffffffffffffff0);
  __s = auStack_e8 + lVar12;
  *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aa3e;
  sVar13 = snd_pcm_hw_params_sizeof();
  *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aa4b;
  memset(__s,0,sVar13);
  lVar18 = _periods;
  *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aa57;
  iVar7 = snd_pcm_hw_params_any(lVar18,__s);
  lVar18 = _periods;
  if (iVar7 < 0) {
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aaf3;
    snd_pcm_close(lVar18);
    poVar14 = (ostream *)(phandle + 8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ab07;
    poVar14 = std::operator<<(poVar14,"RtApiAlsa::probeDeviceOpen: error getting pcm device (");
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ab13;
    poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ab22;
    poVar14 = std::operator<<(poVar14,") parameters, ");
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ab2d;
    pcVar15 = (char *)snd_strerror(iVar7);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ab38;
    poVar14 = std::operator<<(poVar14,pcVar15);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ab47;
    std::operator<<(poVar14,".");
    this = (RtApiAlsa *)phandle;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ab5b;
    std::__cxx11::stringbuf::str();
    goto LAB_0017b084;
  }
  lStack_58 = (long)local_44;
  if ((options == (StreamOptions *)0x0) || ((options->flags & 1) == 0)) {
    phandle[0x21a] = (snd_pcm_t)0x1;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 3;
    uVar5 = *(undefined8 *)(auStack_e8 + lVar12 + -8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aa96;
    iVar7 = snd_pcm_hw_params_set_access(lVar18,__s,uVar5);
    lVar18 = _periods;
    sVar6 = (snd_pcm_t)0x1;
    if (-1 < iVar7) goto LAB_0017abcd;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 4;
    uVar5 = *(undefined8 *)(auStack_e8 + lVar12 + -8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aaaf;
    iVar7 = snd_pcm_hw_params_set_access(lVar18,__s,uVar5);
    sVar6 = (snd_pcm_t)0x0;
LAB_0017abf2:
    lVar18 = _periods;
    phandle[lStack_58 + 0x21b] = sVar6;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ac56;
      snd_pcm_close(lVar18);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ac6a;
      poVar14 = std::operator<<(poVar14,"RtApiAlsa::probeDeviceOpen: error setting pcm device (");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ac76;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ac85;
      poVar14 = std::operator<<(poVar14,") access, ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ac90;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ac9b;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17acaa;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17acbe;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
  }
  else {
    phandle[0x21a] = (snd_pcm_t)0x0;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 4;
    uVar5 = *(undefined8 *)(auStack_e8 + lVar12 + -8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17abc7;
    iVar7 = snd_pcm_hw_params_set_access(lVar18,__s,uVar5);
    lVar18 = _periods;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 3;
      uVar5 = *(undefined8 *)(auStack_e8 + lVar12 + -8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17abed;
      iVar7 = snd_pcm_hw_params_set_access(lVar18,__s,uVar5);
      sVar6 = (snd_pcm_t)0x1;
      goto LAB_0017abf2;
    }
    sVar6 = (snd_pcm_t)0x0;
LAB_0017abcd:
    phandle[lStack_58 + 0x21b] = sVar6;
  }
  *(RtAudioFormat *)(phandle + 600) = format;
  switch(format) {
  case 1:
    uVar20 = 0;
  case 2:
    goto switchD_0017ac25_caseD_2;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_0017ac25_caseD_3:
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0xffffffffffffffff;
    break;
  case 4:
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 6;
    break;
  case 8:
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 10;
    break;
  default:
    if (format == 0x10) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0xe;
    }
    else {
      if (format != 0x20) goto switchD_0017ac25_caseD_3;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10;
    }
  }
  uVar20 = *(ulong *)(auStack_e8 + lVar12 + -8);
switchD_0017ac25_caseD_2:
  lVar18 = _periods;
  *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17acde;
  iVar7 = snd_pcm_hw_params_test_format(lVar18,__s,uVar20 & 0xffffffff);
  lVar18 = _periods;
  if (iVar7 == 0) {
LAB_0017ade6:
    lVar18 = _periods;
    *(RtAudioFormat *)(phandle + lStack_58 * 8 + 0x260) = format;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae05;
    iVar7 = snd_pcm_hw_params_set_format(lVar18,__s,uVar20 & 0xffffffff);
    lVar18 = _periods;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aec1;
      snd_pcm_close(lVar18);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aed5;
      poVar14 = std::operator<<(poVar14,"RtApiAlsa::probeDeviceOpen: error setting pcm device (");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aee1;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aef0;
      poVar14 = std::operator<<(poVar14,") data format, ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aefb;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17af06;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17af15;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17af29;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    phandle[lStack_58 + 0x21d] = (snd_pcm_t)0x0;
    if ((int)uVar20 != 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae31;
      iVar7 = snd_pcm_format_cpu_endian(uVar20 & 0xffffffff);
      lVar18 = _periods;
      if (iVar7 == 0) {
        phandle[lStack_58 + 0x21d] = (snd_pcm_t)0x1;
      }
      else if (iVar7 < 0) {
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae4b;
        snd_pcm_close(lVar18);
        poVar14 = (ostream *)(phandle + 8);
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae5f;
        poVar14 = std::operator<<(poVar14,"RtApiAlsa::probeDeviceOpen: error getting pcm device (");
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae6b;
        poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae7a;
        poVar14 = std::operator<<(poVar14,") endian-ness, ");
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae85;
        pcVar15 = (char *)snd_strerror(iVar7);
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae90;
        poVar14 = std::operator<<(poVar14,pcVar15);
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ae9f;
        std::operator<<(poVar14,".");
        this = (RtApiAlsa *)phandle;
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17aeb3;
        std::__cxx11::stringbuf::str();
        goto LAB_0017b084;
      }
    }
    lVar18 = _periods;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17af50;
    iVar7 = snd_pcm_hw_params_set_rate_near(lVar18,__s,(undefined1 *)((long)&name.field_2 + 0xc),0);
    lVar3 = _periods;
    lVar18 = lStack_58;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b00b;
      snd_pcm_close(lVar3);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b01f;
      poVar14 = std::operator<<(poVar14,
                                "RtApiAlsa::probeDeviceOpen: error setting sample rate on device (")
      ;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b02b;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b03a;
      poVar14 = std::operator<<(poVar14,"), ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b045;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b050;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b05f;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b073;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    *(int *)(phandle + lStack_58 * 4 + 0x22c) = (int)local_50;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17af79;
    iVar7 = snd_pcm_hw_params_get_channels_max(__s,&sampleRate_local);
    lVar3 = _periods;
    if (iVar7 < 0) {
LAB_0017af8f:
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17af98;
      snd_pcm_close(lVar3);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17afac;
      poVar14 = std::operator<<(poVar14,
                                "RtApiAlsa::probeDeviceOpen: requested channel parameters not supported by device ("
                               );
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17afb8;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17afc7;
      poVar14 = std::operator<<(poVar14,"), ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17afd2;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17afdd;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17afec;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b000;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    uVar8 = (int)local_50 + firstChannel;
    if (sampleRate_local < uVar8) goto LAB_0017af8f;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b0c1;
    iVar7 = snd_pcm_hw_params_get_channels_min(__s,&sampleRate_local);
    lVar3 = _periods;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b216;
      snd_pcm_close(lVar3);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b22a;
      poVar14 = std::operator<<(poVar14,
                                "RtApiAlsa::probeDeviceOpen: error getting minimum channels for device ("
                               );
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b236;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b245;
      poVar14 = std::operator<<(poVar14,"), ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b250;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b25b;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b26a;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b27e;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    if (uVar8 < sampleRate_local) {
      uVar8 = sampleRate_local;
    }
    *(uint *)(phandle + lVar18 * 4 + 0x234) = uVar8;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b0ef;
    iVar7 = snd_pcm_hw_params_set_channels(lVar3,__s);
    lVar3 = _periods;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b28c;
      snd_pcm_close(lVar3);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b2a0;
      poVar14 = std::operator<<(poVar14,
                                "RtApiAlsa::probeDeviceOpen: error setting channels for device (");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b2ac;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b2bb;
      poVar14 = std::operator<<(poVar14,"), ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b2c6;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b2d1;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b2e0;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b2f4;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    val._4_4_ = 0;
    _uStack_d8 = (ulong)*bufferSize;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b120;
    iVar7 = snd_pcm_hw_params_set_period_size_near(lVar3,__s);
    lVar3 = _periods;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b302;
      snd_pcm_close(lVar3);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b316;
      poVar14 = std::operator<<(poVar14,
                                "RtApiAlsa::probeDeviceOpen: error setting period size for device ("
                               );
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b322;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b331;
      poVar14 = std::operator<<(poVar14,"), ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b33c;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b347;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b356;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b36a;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    *bufferSize = uStack_d8;
    local_48 = 0;
    if (options == (StreamOptions *)0x0) {
LAB_0017b166:
      local_48 = 4;
    }
    else {
      uVar8 = 0;
      if ((options->flags & 2) != 0) {
        local_48 = 2;
        *(undefined8 *)(auStack_e8 + lVar12 + -8) = 2;
        uVar8 = (uint)*(undefined8 *)(auStack_e8 + lVar12 + -8);
      }
      uVar9 = options->numberOfBuffers;
      if (uVar9 != 0) {
        uVar8 = uVar9;
        local_48 = uVar9;
      }
      if (uVar8 < 2) goto LAB_0017b166;
    }
    lVar3 = _periods;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b184;
    iVar7 = snd_pcm_hw_params_set_periods_near(lVar3,__s,&local_48,(long)&val + 4);
    lVar3 = _periods;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b378;
      snd_pcm_close(lVar3);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b38c;
      poVar14 = std::operator<<(poVar14,
                                "RtApiAlsa::probeDeviceOpen: error setting periods for device (");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b398;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b3a7;
      poVar14 = std::operator<<(poVar14,"), ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b3b2;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b3bd;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b3cc;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b3e0;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    if (((local_44 == INPUT) && (*(int *)(phandle + 0x1f8) == 0)) &&
       (*bufferSize != *(uint *)(phandle + 0x224))) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b1c5;
      snd_pcm_close(lVar3);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b1d9;
      poVar14 = std::operator<<(poVar14,
                                "RtApiAlsa::probeDeviceOpen: system error setting buffer size for duplex stream on device ("
                               );
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b1e5;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b1f4;
      std::operator<<(poVar14,").");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b208;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    *(uint *)(phandle + 0x224) = *bufferSize;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b3f7;
    iVar7 = snd_pcm_hw_params(lVar3);
    lVar3 = _periods;
    if (iVar7 < 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b6c0;
      snd_pcm_close(lVar3);
      poVar14 = (ostream *)(phandle + 8);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b6d4;
      poVar14 = std::operator<<(poVar14,
                                "RtApiAlsa::probeDeviceOpen: error installing hardware configuration on device ("
                               );
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b6e0;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b6ef;
      poVar14 = std::operator<<(poVar14,"), ");
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b6fa;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b705;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b714;
      std::operator<<(poVar14,".");
      this = (RtApiAlsa *)phandle;
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b728;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17b407;
    lVar12 = snd_pcm_sw_params_sizeof();
    __s = __s + -(lVar12 + 0xfU & 0xfffffffffffffff0);
    *(undefined8 *)(__s + -8) = 0x17b41d;
    sVar13 = snd_pcm_sw_params_sizeof();
    *(undefined8 *)(__s + -8) = 0x17b42a;
    memset(__s,0,sVar13);
    lVar12 = _periods;
    *(undefined8 *)(__s + -8) = 0x17b436;
    snd_pcm_sw_params_current(lVar12,__s);
    lVar12 = _periods;
    uVar8 = *bufferSize;
    *(undefined8 *)(__s + -8) = 0x17b448;
    snd_pcm_sw_params_set_start_threshold(lVar12,__s,uVar8);
    lVar12 = _periods;
    *(undefined8 *)(__s + -8) = 0xffffffffffffffff;
    uVar5 = *(undefined8 *)(__s + -8);
    *(undefined8 *)(__s + -8) = 0x17b457;
    snd_pcm_sw_params_set_stop_threshold(lVar12,__s,uVar5);
    lVar12 = _periods;
    *(undefined8 *)(__s + -8) = 0x17b465;
    snd_pcm_sw_params_set_silence_threshold(lVar12,__s,0);
    *(undefined8 *)(__s + -8) = 0x17b474;
    snd_pcm_sw_params_get_boundary(__s,&periodSize);
    this = (RtApiAlsa *)phandle;
    lVar12 = _periods;
    *(undefined8 *)(__s + -8) = 0x17b48b;
    snd_pcm_sw_params_set_silence_size(lVar12,__s,periodSize);
    lVar12 = _periods;
    *(undefined8 *)(__s + -8) = 0x17b497;
    iVar7 = snd_pcm_sw_params(lVar12);
    lVar12 = _periods;
    if (iVar7 < 0) {
      *(undefined8 *)(__s + -8) = 0x17b736;
      snd_pcm_close(lVar12);
      *(undefined8 *)(__s + -8) = 0x17b746;
      poVar14 = std::operator<<((ostream *)((long)this + 8),
                                "RtApiAlsa::probeDeviceOpen: error installing software configuration on device ("
                               );
      *(undefined8 *)(__s + -8) = 0x17b752;
      poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
      *(undefined8 *)(__s + -8) = 0x17b761;
      poVar14 = std::operator<<(poVar14,"), ");
      *(undefined8 *)(__s + -8) = 0x17b76c;
      pcVar15 = (char *)snd_strerror(iVar7);
      *(undefined8 *)(__s + -8) = 0x17b777;
      poVar14 = std::operator<<(poVar14,pcVar15);
      *(undefined8 *)(__s + -8) = 0x17b786;
      std::operator<<(poVar14,".");
      *(undefined8 *)(__s + -8) = 0x17b796;
      std::__cxx11::stringbuf::str();
      goto LAB_0017b084;
    }
    lVar12 = *(long *)((long)this + 600);
    lVar3 = *(long *)((long)this + lVar18 * 8 + 0x260);
    *(bool *)((long)this + lVar18 + 0x218) = lVar12 != lVar3;
    uVar9 = *(uint *)((long)this + lVar18 * 4 + 0x22c);
    uVar8 = *(uint *)((long)this + lVar18 * 4 + 0x234);
    *(undefined8 *)(__s + -8) = 1;
    sVar6 = SUB81(*(undefined8 *)(__s + -8),0);
    if (uVar8 <= uVar9) {
      sVar6 = (snd_pcm_t)(lVar12 != lVar3);
    }
    *(snd_pcm_t *)((long)this + lVar18 + 0x218) = sVar6;
    if ((*(snd_pcm_t *)((long)this + 0x21a) != *(snd_pcm_t *)((long)this + lVar18 + 0x21b)) &&
       (1 < *(uint *)((long)this + lVar18 * 4 + 0x22c))) {
      *(snd_pcm_t *)((long)this + lVar18 + 0x218) = (snd_pcm_t)0x1;
    }
    plVar17 = *(long **)((long)this + 0x1f0);
    if (plVar17 == (long *)0x0) {
      *(undefined8 *)(__s + -8) = 0x50;
      uVar20 = *(ulong *)(__s + -8);
      *(undefined8 *)(__s + -8) = 0x17b7a3;
      plVar17 = (long *)operator_new(uVar20);
      *(undefined1 *)(plVar17 + 9) = 0;
      *plVar17 = 0;
      plVar17[1] = 0;
      *(undefined4 *)((long)plVar17 + 0xf) = 0;
      *(undefined8 *)(__s + -8) = 0x17b7c2;
      iVar7 = pthread_cond_init((pthread_cond_t *)(plVar17 + 3),(pthread_condattr_t *)0x0);
      if (iVar7 == 0) {
        *(long **)((long)this + 0x1f0) = plVar17;
        *plVar17 = 0;
        plVar17[1] = 0;
        goto LAB_0017b512;
      }
      local_50 = plVar17;
      *(undefined8 *)(__s + -8) = 0x17b7e1;
      std::__cxx11::string::assign((char *)((long)this + 0x180));
    }
    else {
LAB_0017b512:
      plVar17[lVar18] = _periods;
      _periods = 0;
      iVar7 = *(int *)((long)this + lVar18 * 4 + 0x22c);
      uVar8 = *bufferSize;
      RVar4 = *(RtAudioFormat *)((long)this + 600);
      local_50 = plVar17;
      *(undefined8 *)(__s + -8) = 0x17b541;
      uVar9 = RtApi::formatBytes(&this->super_RtApi,RVar4);
      *(undefined8 *)(__s + -8) = 1;
      sVar13 = *(size_t *)(__s + -8);
      *(undefined8 *)(__s + -8) = 0x17b554;
      pvVar16 = calloc((ulong)(uVar8 * iVar7 * uVar9),sVar13);
      *(void **)((long)this + lVar18 * 8 + 0x200) = pvVar16;
      if (pvVar16 != (void *)0x0) {
        if (*(snd_pcm_t *)((long)this + lVar18 + 0x218) == (snd_pcm_t)0x1) {
          iVar7 = *(int *)((long)this + lVar18 * 4 + 0x234);
          RVar4 = *(RtAudioFormat *)((long)this + lVar18 * 8 + 0x260);
          *(undefined8 *)(__s + -8) = 0x17b58f;
          uVar8 = RtApi::formatBytes(&this->super_RtApi,RVar4);
          pvVar16 = *(void **)((long)this + 0x210);
          if (pvVar16 != (void *)0x0 && (local_44 == INPUT && *(int *)((long)this + 0x1f8) == 0)) {
            iVar10 = *(int *)((long)this + 0x234);
            RVar4 = *(RtAudioFormat *)((long)this + 0x260);
            *(undefined8 *)(__s + -8) = 0x17b5cd;
            uVar9 = RtApi::formatBytes(&this->super_RtApi,RVar4);
            lVar18 = lStack_58;
            if (uVar8 * iVar7 <= uVar9 * iVar10) goto LAB_0017b613;
            pvVar16 = *(void **)((long)this + 0x210);
          }
          uVar9 = *bufferSize;
          *(undefined8 *)(__s + -8) = 0x17b5f0;
          free(pvVar16);
          *(undefined8 *)(__s + -8) = 1;
          this = (RtApiAlsa *)phandle;
          sVar13 = *(size_t *)(__s + -8);
          *(undefined8 *)(__s + -8) = 0x17b5ff;
          pvVar16 = calloc((ulong)uVar9 * (ulong)(uVar8 * iVar7),sVar13);
          *(void **)((long)this + 0x210) = pvVar16;
          lVar18 = lStack_58;
          if (pvVar16 == (void *)0x0) {
            *(undefined8 *)(__s + -8) = 0x17b880;
            std::__cxx11::string::assign((char *)((long)this + 0x180));
            goto LAB_0017b96c;
          }
        }
LAB_0017b613:
        mode_00 = local_44;
        (this->super_RtApi).stream_.sampleRate = name.field_2._12_4_;
        (this->super_RtApi).stream_.nBuffers = local_48;
        (this->super_RtApi).stream_.deviceId[lVar18] = deviceId;
        (this->super_RtApi).stream_.state = STREAM_STOPPED;
        if ((this->super_RtApi).stream_.doConvertBuffer[lVar18] == true) {
          *(undefined8 *)(__s + -8) = 0x17b650;
          RtApi::setConvertInfo(&this->super_RtApi,mode_00,firstChannel);
        }
        if ((local_44 == INPUT) && ((this->super_RtApi).stream_.mode == OUTPUT)) {
          (this->super_RtApi).stream_.mode = DUPLEX;
          *(undefined1 *)(local_50 + 2) = 0;
          lVar12 = *local_50;
          lVar18 = local_50[1];
          *(undefined8 *)(__s + -8) = 0x17b689;
          iVar7 = snd_pcm_link(lVar12,lVar18);
          if (iVar7 != 0) {
            *(undefined8 *)(__s + -8) = 0x17b6a4;
            std::__cxx11::string::assign((char *)&(this->super_RtApi).errorText_);
            bVar19 = true;
            *(undefined8 *)(__s + -8) = 1;
            uVar5 = *(undefined8 *)(__s + -8);
            *(undefined8 *)(__s + -8) = 0x17b6b2;
            RtApi::error(&this->super_RtApi,(RtAudioErrorType)uVar5);
            goto LAB_0017b097;
          }
          *(undefined1 *)(local_50 + 2) = 1;
        }
        else {
          (this->super_RtApi).stream_.mode = local_44;
          __arg = &(this->super_RtApi).stream_.callbackInfo;
          (this->super_RtApi).stream_.callbackInfo.object = this;
          *(undefined8 *)(__s + -8) = 0x17b822;
          pthread_attr_init((pthread_attr_t *)local_c0);
          *(undefined8 *)(__s + -8) = 0x17b82c;
          pthread_attr_setdetachstate((pthread_attr_t *)local_c0,0);
          if ((options == (StreamOptions *)0x0) || ((options->flags & 8) == 0)) {
            *(undefined8 *)(__s + -8) = 0x17b848;
            pthread_attr_setschedpolicy((pthread_attr_t *)local_c0,0);
          }
          else {
            (this->super_RtApi).stream_.callbackInfo.doRealtime = true;
            iVar7 = options->priority;
            *(undefined8 *)(__s + -8) = 2;
            __algorithm = (int)*(undefined8 *)(__s + -8);
            *(undefined8 *)(__s + -8) = 0x17b89c;
            iVar10 = sched_get_priority_min(__algorithm);
            *(undefined8 *)(__s + -8) = 0x17b8a7;
            local_dc.__sched_priority = sched_get_priority_max(__algorithm);
            if (iVar7 < local_dc.__sched_priority) {
              local_dc.__sched_priority = iVar7;
            }
            if (iVar7 < iVar10) {
              local_dc.__sched_priority = iVar10;
            }
            *(undefined8 *)(__s + -8) = 0x17b8ce;
            pthread_attr_setschedpolicy((pthread_attr_t *)local_c0,__algorithm);
            *(undefined8 *)(__s + -8) = 0x17b8d8;
            pthread_attr_setscope((pthread_attr_t *)local_c0,0);
            *(undefined8 *)(__s + -8) = 1;
            uVar5 = *(undefined8 *)(__s + -8);
            *(undefined8 *)(__s + -8) = 0x17b8e3;
            pthread_attr_setinheritsched((pthread_attr_t *)local_c0,(int)uVar5);
            this = (RtApiAlsa *)phandle;
            *(undefined8 *)(__s + -8) = 0x17b8f2;
            pthread_attr_setschedparam((pthread_attr_t *)local_c0,&local_dc);
          }
          (this->super_RtApi).stream_.callbackInfo.isRunning = true;
          __newthread = &(this->super_RtApi).stream_.callbackInfo.thread;
          *(undefined8 *)(__s + -8) = 0x17b91d;
          iVar7 = pthread_create(__newthread,(pthread_attr_t *)local_c0,alsaCallbackHandler,__arg);
          *(undefined8 *)(__s + -8) = 0x17b928;
          pthread_attr_destroy((pthread_attr_t *)local_c0);
          if (iVar7 != 0) {
            *(undefined8 *)(__s + -8) = 0x17b945;
            iVar7 = pthread_create(__newthread,(pthread_attr_t *)0x0,alsaCallbackHandler,__arg);
            this = (RtApiAlsa *)phandle;
            if (iVar7 != 0) {
              phandle[0x2c0] = (snd_pcm_t)0x0;
              psVar2 = phandle + 0x180;
              *(undefined8 *)(__s + -8) = 0x17b96c;
              std::__cxx11::string::assign((char *)psVar2);
              goto LAB_0017b96c;
            }
          }
        }
        bVar19 = true;
        goto LAB_0017b097;
      }
      *(undefined8 *)(__s + -8) = 0x17b7f9;
      std::__cxx11::string::assign((char *)((long)this + 0x180));
    }
LAB_0017b96c:
    plVar17 = local_50;
    __cond = (pthread_cond_t *)(local_50 + 3);
    *(undefined8 *)(__s + -8) = 0x17b979;
    pthread_cond_destroy(__cond);
    if (*plVar17 != 0) {
      *(undefined8 *)(__s + -8) = 0x17b986;
      snd_pcm_close();
    }
    if (local_50[1] != 0) {
      *(undefined8 *)(__s + -8) = 0x17b998;
      snd_pcm_close();
    }
    plVar17 = local_50;
    *(undefined8 *)(__s + -8) = 0x17b9a1;
    operator_delete(plVar17);
    *(undefined8 *)((long)this + 0x1f0) = 0;
    if (_periods != 0) {
      *(undefined8 *)(__s + -8) = 0x17b9b7;
      snd_pcm_close();
    }
    for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
      pvVar16 = *(void **)((long)this + lVar12 * 8 + 0x200);
      if (pvVar16 != (void *)0x0) {
        *(undefined8 *)(__s + -8) = 0x17b9d1;
        free(pvVar16);
        *(undefined8 *)((long)this + lVar12 * 8 + 0x200) = 0;
      }
    }
    pvVar16 = *(void **)((long)this + 0x210);
    if (pvVar16 != (void *)0x0) {
      *(undefined8 *)(__s + -8) = 0x17b9f0;
      free(pvVar16);
      *(undefined8 *)((long)this + 0x210) = 0;
    }
    *(undefined4 *)((long)this + 0x1fc) = 0xffffffce;
  }
  else {
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10;
    uVar20 = *(ulong *)(auStack_e8 + lVar12 + -8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17acf9;
    iVar7 = snd_pcm_hw_params_test_format(lVar18,__s,uVar20 & 0xffffffff);
    lVar18 = _periods;
    if (iVar7 == 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x20;
LAB_0017ade5:
      format = *(RtAudioFormat *)(auStack_e8 + lVar12 + -8);
      goto LAB_0017ade6;
    }
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0xe;
    uVar20 = *(ulong *)(auStack_e8 + lVar12 + -8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ad14;
    iVar7 = snd_pcm_hw_params_test_format(lVar18,__s,uVar20 & 0xffffffff);
    lVar18 = _periods;
    if (iVar7 == 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x10;
      goto LAB_0017ade5;
    }
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 10;
    uVar20 = *(ulong *)(auStack_e8 + lVar12 + -8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ad2f;
    iVar7 = snd_pcm_hw_params_test_format(lVar18,__s,uVar20 & 0xffffffff);
    lVar18 = _periods;
    if (iVar7 == 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 8;
      goto LAB_0017ade5;
    }
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 6;
    uVar20 = *(ulong *)(auStack_e8 + lVar12 + -8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ad4a;
    iVar7 = snd_pcm_hw_params_test_format(lVar18,__s,uVar20 & 0xffffffff);
    lVar18 = _periods;
    if (iVar7 == 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 4;
      goto LAB_0017ade5;
    }
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 2;
    uVar20 = *(ulong *)(auStack_e8 + lVar12 + -8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ad65;
    iVar7 = snd_pcm_hw_params_test_format(lVar18,__s,uVar20 & 0xffffffff);
    lVar18 = _periods;
    if (iVar7 == 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 2;
      goto LAB_0017ade5;
    }
    uVar20 = 0;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ad7a;
    iVar7 = snd_pcm_hw_params_test_format(lVar18,__s,0);
    lVar18 = _periods;
    if (iVar7 == 0) {
      *(undefined8 *)(auStack_e8 + lVar12 + -8) = 1;
      goto LAB_0017ade5;
    }
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ad87;
    snd_pcm_close(lVar18);
    poVar14 = (ostream *)(phandle + 8);
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ad9b;
    poVar14 = std::operator<<(poVar14,"RtApiAlsa::probeDeviceOpen: pcm device (");
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17ada7;
    poVar14 = std::operator<<(poVar14,(string *)(attr.__size + 0x30));
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17adb6;
    std::operator<<(poVar14,") data format not supported by RtAudio.");
    this = (RtApiAlsa *)phandle;
    *(undefined8 *)(auStack_e8 + lVar12 + -8) = 0x17adca;
    std::__cxx11::stringbuf::str();
LAB_0017b084:
    *(undefined8 *)(__s + -8) = 0x17b08c;
    std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,(string *)local_c0);
    *(undefined8 *)(__s + -8) = 0x17b094;
    std::__cxx11::string::~string((string *)local_c0);
  }
  bVar19 = false;
LAB_0017b097:
  *(undefined8 *)(__s + -8) = 0x17b0a0;
  std::__cxx11::string::~string((string *)(attr.__size + 0x30));
  return bVar19;
}

Assistant:

bool RtApiAlsa :: probeDeviceOpen( unsigned int deviceId, StreamMode mode, unsigned int channels,
                                   unsigned int firstChannel, unsigned int sampleRate,
                                   RtAudioFormat format, unsigned int *bufferSize,
                                   RtAudio::StreamOptions *options )

{
#if defined(__RTAUDIO_DEBUG__)
  struct SndOutputTdealloc {
    SndOutputTdealloc() : _out(NULL) { snd_output_stdio_attach(&_out, stderr, 0); }
    ~SndOutputTdealloc() { snd_output_close(_out); }
    operator snd_output_t*() { return _out; }
    snd_output_t *_out;
  } out;
#endif

  std::string name;
  for ( auto& id : deviceIdPairs_) {
    if ( id.second == deviceId ) {
      name = id.first;
      break;
    }
  }

  snd_pcm_stream_t stream;
  if ( mode == OUTPUT )
    stream = SND_PCM_STREAM_PLAYBACK;
  else
    stream = SND_PCM_STREAM_CAPTURE;

  snd_pcm_t *phandle;
  int openMode = SND_PCM_ASYNC;
  int result = snd_pcm_open( &phandle, name.c_str(), stream, openMode );
  if ( result < 0 ) {
    if ( mode == OUTPUT )
      errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") won't open for output.";
    else
      errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") won't open for input.";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Fill the parameter structure.
  snd_pcm_hw_params_t *hw_params;
  snd_pcm_hw_params_alloca( &hw_params );
  result = snd_pcm_hw_params_any( phandle, hw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting pcm device (" << name << ") parameters, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf( stderr, "\nRtApiAlsa: dump hardware params just after device open:\n\n" );
  snd_pcm_hw_params_dump( hw_params, out );
#endif

  // Set access ... check user preference.
  if ( options && options->flags & RTAUDIO_NONINTERLEAVED ) {
    stream_.userInterleaved = false;
    result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_NONINTERLEAVED );
    if ( result < 0 ) {
      result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_INTERLEAVED );
      stream_.deviceInterleaved[mode] =  true;
    }
    else
      stream_.deviceInterleaved[mode] = false;
  }
  else {
    stream_.userInterleaved = true;
    result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_INTERLEAVED );
    if ( result < 0 ) {
      result = snd_pcm_hw_params_set_access( phandle, hw_params, SND_PCM_ACCESS_RW_NONINTERLEAVED );
      stream_.deviceInterleaved[mode] =  false;
    }
    else
      stream_.deviceInterleaved[mode] =  true;
  }

  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting pcm device (" << name << ") access, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine how to set the device format.
  stream_.userFormat = format;
  snd_pcm_format_t deviceFormat = SND_PCM_FORMAT_UNKNOWN;

  if ( format == RTAUDIO_SINT8 )
    deviceFormat = SND_PCM_FORMAT_S8;
  else if ( format == RTAUDIO_SINT16 )
    deviceFormat = SND_PCM_FORMAT_S16;
  else if ( format == RTAUDIO_SINT24 )
    deviceFormat = SND_PCM_FORMAT_S24;
  else if ( format == RTAUDIO_SINT32 )
    deviceFormat = SND_PCM_FORMAT_S32;
  else if ( format == RTAUDIO_FLOAT32 )
    deviceFormat = SND_PCM_FORMAT_FLOAT;
  else if ( format == RTAUDIO_FLOAT64 )
    deviceFormat = SND_PCM_FORMAT_FLOAT64;

  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat) == 0) {
    stream_.deviceFormat[mode] = format;
    goto setFormat;
  }

  // The user requested format is not natively supported by the device.
  deviceFormat = SND_PCM_FORMAT_FLOAT64;
  if ( snd_pcm_hw_params_test_format( phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT64;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_FLOAT;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_FLOAT32;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S32;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT32;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S24;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT24;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S16;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT16;
    goto setFormat;
  }

  deviceFormat = SND_PCM_FORMAT_S8;
  if ( snd_pcm_hw_params_test_format(phandle, hw_params, deviceFormat ) == 0 ) {
    stream_.deviceFormat[mode] = RTAUDIO_SINT8;
    goto setFormat;
  }

  // If we get here, no supported format was found.
  snd_pcm_close( phandle );
  errorStream_ << "RtApiAlsa::probeDeviceOpen: pcm device (" << name << ") data format not supported by RtAudio.";
  errorText_ = errorStream_.str();
  return FAILURE;

 setFormat:
  result = snd_pcm_hw_params_set_format( phandle, hw_params, deviceFormat );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting pcm device (" << name << ") data format, " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine whether byte-swaping is necessary.
  stream_.doByteSwap[mode] = false;
  if ( deviceFormat != SND_PCM_FORMAT_S8 ) {
    result = snd_pcm_format_cpu_endian( deviceFormat );
    if ( result == 0 )
      stream_.doByteSwap[mode] = true;
    else if (result < 0) {
      snd_pcm_close( phandle );
      errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting pcm device (" << name << ") endian-ness, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      return FAILURE;
    }
  }

  // Set the sample rate.
  result = snd_pcm_hw_params_set_rate_near( phandle, hw_params, (unsigned int*) &sampleRate, 0 );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting sample rate on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Determine the number of channels for this device.  We support a possible
  // minimum device channel number > than the value requested by the user.
  stream_.nUserChannels[mode] = channels;
  unsigned int value;
  result = snd_pcm_hw_params_get_channels_max( hw_params, &value );
  unsigned int deviceChannels = value;
  if ( result < 0 || deviceChannels < channels + firstChannel ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: requested channel parameters not supported by device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  result = snd_pcm_hw_params_get_channels_min( hw_params, &value );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error getting minimum channels for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }
  deviceChannels = value;
  if ( deviceChannels < channels + firstChannel ) deviceChannels = channels + firstChannel;
  stream_.nDeviceChannels[mode] = deviceChannels;

  // Set the device channels.
  result = snd_pcm_hw_params_set_channels( phandle, hw_params, deviceChannels );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting channels for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // Set the buffer (or period) size.
  int dir = 0;
  snd_pcm_uframes_t periodSize = *bufferSize;
  result = snd_pcm_hw_params_set_period_size_near( phandle, hw_params, &periodSize, &dir );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting period size for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }
  *bufferSize = periodSize;

  // Set the buffer number, which in ALSA is referred to as the "period".
  unsigned int periods = 0;
  if ( options && options->flags & RTAUDIO_MINIMIZE_LATENCY ) periods = 2;
  if ( options && options->numberOfBuffers > 0 ) periods = options->numberOfBuffers;
  if ( periods < 2 ) periods = 4; // a fairly safe default value
  result = snd_pcm_hw_params_set_periods_near( phandle, hw_params, &periods, &dir );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error setting periods for device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  // If attempting to setup a duplex stream, the bufferSize parameter
  // MUST be the same in both directions!
  if ( stream_.mode == OUTPUT && mode == INPUT && *bufferSize != stream_.bufferSize ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: system error setting buffer size for duplex stream on device (" << name << ").";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

  stream_.bufferSize = *bufferSize;

  // Install the hardware configuration
  result = snd_pcm_hw_params( phandle, hw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error installing hardware configuration on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf(stderr, "\nRtApiAlsa: dump hardware params after installation:\n\n");
  snd_pcm_hw_params_dump( hw_params, out );
#endif

  // Set the software configuration to fill buffers with zeros and prevent device stopping on xruns.
  snd_pcm_sw_params_t *sw_params = NULL;
  snd_pcm_sw_params_alloca( &sw_params );
  snd_pcm_sw_params_current( phandle, sw_params );
  snd_pcm_sw_params_set_start_threshold( phandle, sw_params, *bufferSize );
  snd_pcm_sw_params_set_stop_threshold( phandle, sw_params, ULONG_MAX );
  snd_pcm_sw_params_set_silence_threshold( phandle, sw_params, 0 );

  // The following two settings were suggested by Theo Veenker
  //snd_pcm_sw_params_set_avail_min( phandle, sw_params, *bufferSize );
  //snd_pcm_sw_params_set_xfer_align( phandle, sw_params, 1 );

  // here are two options for a fix
  //snd_pcm_sw_params_set_silence_size( phandle, sw_params, ULONG_MAX );
  snd_pcm_uframes_t val;
  snd_pcm_sw_params_get_boundary( sw_params, &val );
  snd_pcm_sw_params_set_silence_size( phandle, sw_params, val );

  result = snd_pcm_sw_params( phandle, sw_params );
  if ( result < 0 ) {
    snd_pcm_close( phandle );
    errorStream_ << "RtApiAlsa::probeDeviceOpen: error installing software configuration on device (" << name << "), " << snd_strerror( result ) << ".";
    errorText_ = errorStream_.str();
    return FAILURE;
  }

#if defined(__RTAUDIO_DEBUG__)
  fprintf(stderr, "\nRtApiAlsa: dump software params after installation:\n\n");
  snd_pcm_sw_params_dump( sw_params, out );
#endif

  // Set flags for buffer conversion
  stream_.doConvertBuffer[mode] = false;
  if ( stream_.userFormat != stream_.deviceFormat[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.nUserChannels[mode] < stream_.nDeviceChannels[mode] )
    stream_.doConvertBuffer[mode] = true;
  if ( stream_.userInterleaved != stream_.deviceInterleaved[mode] &&
       stream_.nUserChannels[mode] > 1 )
    stream_.doConvertBuffer[mode] = true;

  // Allocate the ApiHandle if necessary and then save.
  AlsaHandle *apiInfo = 0;
  if ( stream_.apiHandle == 0 ) {
    try {
      apiInfo = (AlsaHandle *) new AlsaHandle;
    }
    catch ( std::bad_alloc& ) {
      errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating AlsaHandle memory.";
      goto error;
    }

    if ( pthread_cond_init( &apiInfo->runnable_cv, NULL ) ) {
      errorText_ = "RtApiAlsa::probeDeviceOpen: error initializing pthread condition variable.";
      goto error;
    }

    stream_.apiHandle = (void *) apiInfo;
    apiInfo->handles[0] = 0;
    apiInfo->handles[1] = 0;
  }
  else {
    apiInfo = (AlsaHandle *) stream_.apiHandle;
  }
  apiInfo->handles[mode] = phandle;
  phandle = 0;

  // Allocate necessary internal buffers.
  unsigned long bufferBytes;
  bufferBytes = stream_.nUserChannels[mode] * *bufferSize * formatBytes( stream_.userFormat );
  stream_.userBuffer[mode] = (char *) calloc( bufferBytes, 1 );
  if ( stream_.userBuffer[mode] == NULL ) {
    errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating user buffer memory.";
    goto error;
  }

  if ( stream_.doConvertBuffer[mode] ) {

    bool makeBuffer = true;
    bufferBytes = stream_.nDeviceChannels[mode] * formatBytes( stream_.deviceFormat[mode] );
    if ( mode == INPUT ) {
      if ( stream_.mode == OUTPUT && stream_.deviceBuffer ) {
        unsigned long bytesOut = stream_.nDeviceChannels[0] * formatBytes( stream_.deviceFormat[0] );
        if ( bufferBytes <= bytesOut ) makeBuffer = false;
      }
    }

    if ( makeBuffer ) {
      bufferBytes *= *bufferSize;
      if ( stream_.deviceBuffer ) free( stream_.deviceBuffer );
      stream_.deviceBuffer = (char *) calloc( bufferBytes, 1 );
      if ( stream_.deviceBuffer == NULL ) {
        errorText_ = "RtApiAlsa::probeDeviceOpen: error allocating device buffer memory.";
        goto error;
      }
    }
  }

  stream_.sampleRate = sampleRate;
  stream_.nBuffers = periods;
  stream_.deviceId[mode] = deviceId;
  stream_.state = STREAM_STOPPED;

  // Setup the buffer conversion information structure.
  if ( stream_.doConvertBuffer[mode] ) setConvertInfo( mode, firstChannel );

  // Setup thread if necessary.
  if ( stream_.mode == OUTPUT && mode == INPUT ) {
    // We had already set up an output stream.
    stream_.mode = DUPLEX;
    // Link the streams if possible.
    apiInfo->synchronized = false;
    if ( snd_pcm_link( apiInfo->handles[0], apiInfo->handles[1] ) == 0 )
      apiInfo->synchronized = true;
    else {
      errorText_ = "RtApiAlsa::probeDeviceOpen: unable to synchronize input and output devices.";
      error( RTAUDIO_WARNING );
    }
  }
  else {
    stream_.mode = mode;

    // Setup callback thread.
    stream_.callbackInfo.object = (void *) this;

    // Set the thread attributes for joinable and realtime scheduling
    // priority (optional).  The higher priority will only take affect
    // if the program is run as root or suid. Note, under Linux
    // processes with CAP_SYS_NICE privilege, a user can change
    // scheduling policy and priority (thus need not be root). See
    // POSIX "capabilities".
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
#ifdef SCHED_RR // Undefined with some OSes (e.g. NetBSD 1.6.x with GNU Pthread)
    if ( options && options->flags & RTAUDIO_SCHEDULE_REALTIME ) {
      stream_.callbackInfo.doRealtime = true;
      struct sched_param param;
      int priority = options->priority;
      int min = sched_get_priority_min( SCHED_RR );
      int max = sched_get_priority_max( SCHED_RR );
      if ( priority < min ) priority = min;
      else if ( priority > max ) priority = max;
      param.sched_priority = priority;

      // Set the policy BEFORE the priority. Otherwise it fails.
      pthread_attr_setschedpolicy(&attr, SCHED_RR);
      pthread_attr_setscope (&attr, PTHREAD_SCOPE_SYSTEM);
      // This is definitely required. Otherwise it fails.
      pthread_attr_setinheritsched(&attr, PTHREAD_EXPLICIT_SCHED);
      pthread_attr_setschedparam(&attr, &param);
    }
    else
      pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#else
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );
#endif

    stream_.callbackInfo.isRunning = true;
    result = pthread_create( &stream_.callbackInfo.thread, &attr, alsaCallbackHandler, &stream_.callbackInfo );
    pthread_attr_destroy( &attr );
    if ( result ) {
      // Failed. Try instead with default attributes.
      result = pthread_create( &stream_.callbackInfo.thread, NULL, alsaCallbackHandler, &stream_.callbackInfo );
      if ( result ) {
        stream_.callbackInfo.isRunning = false;
        errorText_ = "RtApiAlsa::error creating callback thread!";
        goto error;
      }
    }
  }

  return SUCCESS;

 error:
  if ( apiInfo ) {
    pthread_cond_destroy( &apiInfo->runnable_cv );
    if ( apiInfo->handles[0] ) snd_pcm_close( apiInfo->handles[0] );
    if ( apiInfo->handles[1] ) snd_pcm_close( apiInfo->handles[1] );
    delete apiInfo;
    stream_.apiHandle = 0;
  }

  if ( phandle) snd_pcm_close( phandle );

  for ( int i=0; i<2; i++ ) {
    if ( stream_.userBuffer[i] ) {
      free( stream_.userBuffer[i] );
      stream_.userBuffer[i] = 0;
    }
  }

  if ( stream_.deviceBuffer ) {
    free( stream_.deviceBuffer );
    stream_.deviceBuffer = 0;
  }

  stream_.state = STREAM_CLOSED;
  return FAILURE;
}